

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O1

range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
__thiscall tchecker::system::locs_t::locations(locs_t *this,process_id_t pid)

{
  pointer pvVar1;
  ulong uVar2;
  invalid_argument *this_00;
  ulong uVar3;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar4;
  
  uVar2 = (ulong)pid;
  pvVar1 = (this->_process_locs).
           super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_process_locs).
                 super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    rVar4._end.super_const_iterator._M_current =
         (const_iterator)
         (shared_ptr<tchecker::system::loc_t> *)
         *(const_iterator *)
          ((long)&pvVar1[uVar2].
                  super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                  ._M_impl.super__Vector_impl_data + 8);
    rVar4._begin.super_const_iterator._M_current =
         (const_iterator)
         (shared_ptr<tchecker::system::loc_t> *)
         *(const_iterator *)
          &pvVar1[uVar2].
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data;
    return rVar4;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"tchecker::locs_t::locations: pid out of range");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::range_t<tchecker::system::locs_t::const_iterator_t> locs_t::locations(tchecker::process_id_t pid) const
{
  if (pid >= _process_locs.size())
    throw std::invalid_argument("tchecker::locs_t::locations: pid out of range");
  return tchecker::make_range(const_iterator_t{_process_locs[pid].begin()}, const_iterator_t{_process_locs[pid].end()});
}